

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int wave_chain(int pi,char *buf,uint bufSize)

{
  int iVar1;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)bufSize;
  ext[0].ptr = buf;
  iVar1 = pigpio_command_ext(pi,0x5d,0,0,bufSize,1,ext,1);
  return iVar1;
}

Assistant:

int wave_chain(int pi, char *buf, unsigned bufSize)
{
   gpioExtent_t ext[1];

   /*
   p1=0
   p2=0
   p3=bufSize
   ## extension ##
   char buf[bufSize]
   */

   ext[0].size = bufSize;
   ext[0].ptr = buf;

   return pigpio_command_ext
      (pi, PI_CMD_WVCHA, 0, 0, bufSize, 1, ext, 1);
}